

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

FilePath *
testing::internal::FilePath::ConcatPaths
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *relative_path)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  undefined1 local_88 [8];
  FilePath dir;
  long local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  size_type *local_48;
  __string_type __str;
  
  if ((directory->pathname_)._M_string_length == 0) {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    pcVar1 = (relative_path->pathname_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (relative_path->pathname_)._M_string_length);
  }
  else {
    RemoveTrailingPathSeparator((FilePath *)local_88,directory);
    local_48 = &__str._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,local_88,dir.pathname_._M_dataplus._M_p + (long)local_88);
    std::__cxx11::string::_M_replace_aux((ulong)&local_48,(ulong)__str._M_dataplus._M_p,0,'\x01');
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_48,(ulong)(relative_path->pathname_)._M_dataplus._M_p
                               );
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_58 = *plVar4;
      uStack_50 = (undefined4)plVar3[3];
      uStack_4c = *(undefined4 *)((long)plVar3 + 0x1c);
      dir.pathname_.field_2._8_8_ = &local_58;
    }
    else {
      local_58 = *plVar4;
      dir.pathname_.field_2._8_8_ = (long *)*plVar3;
    }
    lVar2 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,dir.pathname_.field_2._8_8_,
               lVar2 + dir.pathname_.field_2._8_8_);
    Normalize(__return_storage_ptr__);
    if ((long *)dir.pathname_.field_2._8_8_ != &local_58) {
      operator_delete((void *)dir.pathname_.field_2._8_8_,local_58 + 1);
    }
    if (local_48 != &__str._M_string_length) {
      operator_delete(local_48,__str._M_string_length + 1);
    }
    if (local_88 != (undefined1  [8])&dir.pathname_._M_string_length) {
      operator_delete((void *)local_88,dir.pathname_._M_string_length + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::ConcatPaths(const FilePath& directory,
                               const FilePath& relative_path) {
  if (directory.IsEmpty())
    return relative_path;
  const FilePath dir(directory.RemoveTrailingPathSeparator());
  return FilePath(dir.string() + kPathSeparator + relative_path.string());
}